

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPFakeTransmitter::ClearAcceptList(RTPFakeTransmitter *this)

{
  if (((this->init == true) && (this->created == true)) && (this->receivemode == AcceptSome)) {
    ClearAcceptIgnoreInfo(this);
    return;
  }
  return;
}

Assistant:

void RTPFakeTransmitter::ClearAcceptList()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created && receivemode == RTPTransmitter::AcceptSome)
		ClearAcceptIgnoreInfo();
	MAINMUTEX_UNLOCK
}